

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

void xmlSchemaCleanupTypesInternal(void)

{
  xmlSchemaTypePtr pxVar1;
  xmlChar *pxVar2;
  
  if (xmlSchemaTypeAnyTypeDef != (xmlSchemaTypePtr)0x0) {
    xmlSchemaFreeWildcard(xmlSchemaTypeAnyTypeDef->attributeWildcard);
    pxVar1 = xmlSchemaTypeAnyTypeDef->subtypes;
    if (pxVar1 != (xmlSchemaTypePtr)0x0) {
      pxVar2 = pxVar1->id;
      if (pxVar2 != (xmlChar *)0x0) {
        if (*(long *)(pxVar2 + 0x18) != 0) {
          xmlSchemaFreeWildcard(*(xmlSchemaWildcardPtr *)(*(long *)(pxVar2 + 0x18) + 0x18));
          (*xmlFree)(*(void **)(pxVar1->id + 0x18));
          pxVar2 = pxVar1->id;
        }
        (*xmlFree)(pxVar2);
      }
      (*xmlFree)(pxVar1);
    }
    xmlSchemaTypeAnyTypeDef->subtypes = (xmlSchemaTypePtr)0x0;
    xmlSchemaTypeAnyTypeDef = (xmlSchemaTypePtr)0x0;
  }
  xmlHashFree(xmlSchemaTypesBank,xmlSchemaFreeTypeEntry);
  xmlSchemaTypesBank = (xmlHashTablePtr)0x0;
  return;
}

Assistant:

static void
xmlSchemaCleanupTypesInternal(void) {
    xmlSchemaParticlePtr particle;

    /*
    * Free xs:anyType.
    */
    if (xmlSchemaTypeAnyTypeDef != NULL) {
        /* Attribute wildcard. */
        xmlSchemaFreeWildcard(xmlSchemaTypeAnyTypeDef->attributeWildcard);
        /* Content type. */
        particle = (xmlSchemaParticlePtr) xmlSchemaTypeAnyTypeDef->subtypes;
        if (particle != NULL) {
            if (particle->children != NULL) {
                if (particle->children->children != NULL) {
                    /* Wildcard. */
                    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)
                        particle->children->children->children);
                    xmlFree((xmlSchemaParticlePtr)
                        particle->children->children);
                }
                /* Sequence model group. */
                xmlFree((xmlSchemaModelGroupPtr) particle->children);
            }
            xmlFree((xmlSchemaParticlePtr) particle);
        }
        xmlSchemaTypeAnyTypeDef->subtypes = NULL;
        xmlSchemaTypeAnyTypeDef = NULL;
    }

    xmlHashFree(xmlSchemaTypesBank, xmlSchemaFreeTypeEntry);
    xmlSchemaTypesBank = NULL;
    /* Note that the xmlSchemaType*Def pointers aren't set to NULL. */
}